

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy.cpp
# Opt level: O3

int capture(socket_base_t *capture_,msg_t *msg_,int more_)

{
  int iVar1;
  ssize_t sVar2;
  size_t in_RCX;
  EVP_PKEY_CTX *src;
  int in_R8D;
  msg_t ctrl;
  msg_t mStack_58;
  
  if (capture_ == (socket_base_t *)0x0) {
LAB_00181575:
    iVar1 = 0;
  }
  else {
    iVar1 = zmq::msg_t::init(&mStack_58,(EVP_PKEY_CTX *)msg_);
    if (-1 < iVar1) {
      iVar1 = zmq::msg_t::copy(&mStack_58,(EVP_PKEY_CTX *)msg_,src);
      if (-1 < iVar1) {
        sVar2 = zmq::socket_base_t::send
                          (capture_,(int)&mStack_58,(void *)(ulong)((uint)(more_ != 0) * 2),in_RCX,
                           in_R8D);
        if (-1 < (int)sVar2) goto LAB_00181575;
      }
    }
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int
capture (class zmq::socket_base_t *capture_, zmq::msg_t *msg_, int more_ = 0)
{
    //  Copy message to capture socket if any
    if (capture_) {
        zmq::msg_t ctrl;
        int rc = ctrl.init ();
        if (unlikely (rc < 0))
            return -1;
        rc = ctrl.copy (*msg_);
        if (unlikely (rc < 0))
            return -1;
        rc = capture_->send (&ctrl, more_ ? ZMQ_SNDMORE : 0);
        if (unlikely (rc < 0))
            return -1;
    }
    return 0;
}